

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::TempDir_abi_cxx11_(void)

{
  char *__s;
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  string *in_RDI;
  long lVar2;
  allocator<char> local_49;
  char *local_48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_48[0] = "TEST_TMPDIR";
  local_48[1] = "TMPDIR";
  lVar2 = 0;
  do {
    if (lVar2 == 0x10) {
      __s = "/tmp/";
LAB_001362b4:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)in_RDI,__s,(allocator<char> *)&local_38);
      return in_RDI;
    }
    __s = getenv(*(char **)((long)local_48 + lVar2));
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      sVar1 = strlen(__s);
      if (__s[sVar1 - 1] != '/') {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_49);
        __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_38,1,'/');
        std::__cxx11::string::string((string *)in_RDI,__str);
        std::__cxx11::string::~string((string *)&local_38);
        return in_RDI;
      }
      goto LAB_001362b4;
    }
    lVar2 = lVar2 + 8;
  } while( true );
}

Assistant:

std::string TempDir() {
#if defined(GTEST_CUSTOM_TEMPDIR_FUNCTION_)
  return GTEST_CUSTOM_TEMPDIR_FUNCTION_();
#elif GTEST_OS_WINDOWS || GTEST_OS_WINDOWS_MOBILE
  return GetTempDirFromEnv({"TEST_TMPDIR", "TEMP"}, "\\temp\\", '\\');
#elif GTEST_OS_LINUX_ANDROID
  return GetTempDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/data/local/tmp/", '/');
#else
  return GetTempDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/tmp/", '/');
#endif
}